

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTOIDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall ParserTOIDecPOMDPDiscrete::ParseAgent(ParserTOIDecPOMDPDiscrete *this,Index id)

{
  DecPOMDPDiscrete *this_00;
  bool sparse;
  DecPOMDPDiscrete *this_01;
  long lVar1;
  undefined8 uVar2;
  undefined4 in_ESI;
  string *in_RDI;
  ParserDPOMDPFormat_Spirit parser;
  DecPOMDPDiscrete *decpomdp;
  MultiAgentDecisionProcessDiscrete *madp;
  ParserDPOMDPFormat_Spirit *in_stack_00000560;
  undefined4 in_stack_fffffffffffffdb8;
  Index in_stack_fffffffffffffdbc;
  TransitionObservationIndependentMADPDiscrete *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdd8;
  string *descr;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  string local_a0 [39];
  undefined1 local_79 [56];
  allocator<char> local_41;
  string local_40 [32];
  DecPOMDPDiscrete *local_20;
  MultiAgentDecisionProcessDiscrete *local_18;
  undefined4 local_c;
  
  local_c = in_ESI;
  local_18 = TransitionObservationIndependentMADPDiscrete::GetIndividualMADPD
                       (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
  this_01 = (DecPOMDPDiscrete *)operator_new(0x230);
  __s = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,(char *)__s,(allocator<char> *)this_01);
  descr = (string *)local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,(char *)__s,(allocator<char> *)this_01);
  MultiAgentDecisionProcess::GetProblemFile_abi_cxx11_
            ((MultiAgentDecisionProcess *)
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  DecPOMDPDiscrete::DecPOMDPDiscrete(this_01,in_RDI,descr,in_stack_fffffffffffffdd8);
  local_20 = this_01;
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)(local_79 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  this_00 = local_20;
  sparse = MultiAgentDecisionProcessDiscrete::GetSparse(local_18);
  MultiAgentDecisionProcessDiscrete::SetSparse
            (&this_00->super_MultiAgentDecisionProcessDiscrete,sparse);
  DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::ParserDPOMDPFormat_Spirit
            ((ParserDPOMDPFormat_Spirit *)in_stack_fffffffffffffdc0,
             (DecPOMDPDiscrete *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::Parse(in_stack_00000560);
  lVar1 = (**(code **)(*(long *)&(local_20->super_MultiAgentDecisionProcessDiscrete).
                                 super_MultiAgentDecisionProcess + 0x10))();
  if (lVar1 != 1) {
    uVar2 = __cxa_allocate_exception(0x28);
    E::E((E *)this_01,(char *)in_RDI);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  (**(code **)(*(long *)in_RDI + 0x18))(in_RDI,local_20,local_c);
  DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::~ParserDPOMDPFormat_Spirit
            ((ParserDPOMDPFormat_Spirit *)in_stack_fffffffffffffdc0);
  return;
}

Assistant:

void ParserTOIDecPOMDPDiscrete::ParseAgent(Index id)
{
    MultiAgentDecisionProcessDiscrete* madp = 
        _m_problem->GetIndividualMADPD(id);

    DecPOMDPDiscrete *decpomdp;
    decpomdp=new DecPOMDPDiscrete("", "", madp->GetProblemFile());
    decpomdp->SetSparse(madp->GetSparse());

    DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit parser(decpomdp);
    parser.Parse();

    if(decpomdp->GetNrAgents()!=1)
        throw(E("ParserTOIDecPOMDPDiscrete::ParseAgent individual models can only be defined for a single agent"));

    StoreDecPOMDP(decpomdp,id);
}